

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::Token>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::Token> *this,double t)

{
  undefined1 local_48 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<tinyusdz::Token> *this_local;
  
  s._40_8_ = t;
  Sample::Sample((Sample *)local_48);
  local_48 = (undefined1  [8])s._40_8_;
  s.value.str_.field_2._M_local_buf[8] = '\x01';
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Token>::Sample>>
              *)this,(Sample *)local_48);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_48);
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }